

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UChar32 c,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  uint uVar4;
  int iVar5;
  UnicodeString *pUVar6;
  ushort uVar7;
  int iVar8;
  __off_t __length;
  int iVar9;
  undefined1 auVar10 [16];
  
  if ((isLiteral != '\0') || (0x5e < c - 0x20U && escapeUnprintable != '\0')) {
    sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = (uint)sVar1;
    iVar5 = (quoteBuf->fUnion).fFields.fLength;
    iVar8 = (int)uVar4 >> 5;
    if (sVar1 < 0) {
      iVar8 = iVar5;
    }
    if (0 < iVar8) {
      while( true ) {
        iVar8 = (int)(short)uVar4 >> 5;
        if ((short)uVar4 < 0) {
          iVar8 = iVar5;
        }
        if (((iVar8 < 2) || (cVar3 = UnicodeString::doCharAt(quoteBuf,0), cVar3 != L'\'')) ||
           (cVar3 = UnicodeString::doCharAt(quoteBuf,1), cVar3 != L'\'')) break;
        pUVar6 = UnicodeString::append(rule,L'\\');
        UnicodeString::append(pUVar6,L'\'');
        UnicodeString::remove(quoteBuf,(char *)0x0);
        uVar4 = (uint)(ushort)(quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        iVar5 = (quoteBuf->fUnion).fFields.fLength;
      }
      iVar5 = 0;
      while( true ) {
        uVar7 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        iVar8 = (quoteBuf->fUnion).fFields.fLength;
        iVar9 = (int)(short)uVar7 >> 5;
        if ((short)uVar7 < 0) {
          iVar9 = iVar8;
        }
        if (iVar9 < 2) break;
        cVar3 = UnicodeString::doCharAt(quoteBuf,iVar9 + -2);
        uVar7 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        iVar8 = (quoteBuf->fUnion).fFields.fLength;
        if (cVar3 != L'\'') break;
        iVar9 = (int)(short)uVar7 >> 5;
        if ((short)uVar7 < 0) {
          iVar9 = iVar8;
        }
        cVar3 = UnicodeString::doCharAt(quoteBuf,iVar9 + -1);
        uVar7 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
        iVar8 = (quoteBuf->fUnion).fFields.fLength;
        if (cVar3 != L'\'') break;
        iVar9 = (int)(short)uVar7 >> 5;
        if ((short)uVar7 < 0) {
          iVar9 = iVar8;
        }
        UnicodeString::truncate(quoteBuf,(char *)(ulong)(iVar9 - 2),(ulong)uVar7);
        iVar5 = iVar5 + 1;
      }
      iVar9 = (int)(short)uVar7 >> 5;
      if ((short)uVar7 < 0) {
        iVar9 = iVar8;
      }
      if (0 < iVar9) {
        UnicodeString::append(rule,L'\'');
        UnicodeString::append(rule,quoteBuf);
        UnicodeString::append(rule,L'\'');
        UnicodeString::truncate(quoteBuf,(char *)0x0,__length);
      }
      for (; 0 < iVar5; iVar5 = iVar5 + -1) {
        pUVar6 = UnicodeString::append(rule,L'\\');
        UnicodeString::append(pUVar6,L'\'');
      }
    }
    if (c == -1) {
      return;
    }
    if (c == 0x20) {
      sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (rule->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      if (iVar5 < 1) {
        return;
      }
      cVar3 = UnicodeString::doCharAt(rule,iVar5 + -1);
      if (cVar3 == L' ') {
        return;
      }
      c = 0x20;
    }
    else if ((escapeUnprintable != '\0') &&
            (UVar2 = ICU_Utility::escapeUnprintable(rule,c), UVar2 != '\0')) {
      return;
    }
    goto LAB_002ea0a9;
  }
  sVar1 = (quoteBuf->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (quoteBuf->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  if (iVar5 == 0) {
    if ((c == 0x5c) || (c == 0x27)) {
      UnicodeString::append(rule,L'\\');
      goto LAB_002ea0a9;
    }
LAB_002ea045:
    auVar10._0_4_ = -(uint)(0x7fffffa1 < (int)(c - 0x7fU ^ 0x80000000));
    auVar10._4_4_ = -(uint)(-0x7ffffff7 < (int)(c - 0x30U ^ 0x80000000));
    auVar10._8_4_ = -(uint)(-0x7fffffe7 < (int)(c - 0x41U ^ 0x80000000));
    auVar10._12_4_ = -(uint)(-0x7fffffe7 < (int)(c - 0x61U ^ 0x80000000));
    iVar5 = movmskps(iVar5,auVar10);
    if ((iVar5 != 0xf) && (UVar2 = PatternProps::isWhiteSpace(c), UVar2 == '\0')) goto LAB_002ea0a9;
  }
  else if (iVar5 < 1) goto LAB_002ea045;
  UnicodeString::append(quoteBuf,c);
  if (c != 0x27) {
    return;
  }
  c = 0x27;
  rule = quoteBuf;
LAB_002ea0a9:
  UnicodeString::append(rule,c);
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               UChar32 c,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    // If we are escaping unprintables, then escape them outside
    // quotes.  \u and \U are not recognized within quotes.  The same
    // logic applies to literals, but literals are never escaped.
    if (isLiteral ||
        (escapeUnprintable && ICU_Utility::isUnprintable(c))) {
        if (quoteBuf.length() > 0) {
            // We prefer backslash APOSTROPHE to double APOSTROPHE
            // (more readable, less similar to ") so if there are
            // double APOSTROPHEs at the ends, we pull them outside
            // of the quote.

            // If the first thing in the quoteBuf is APOSTROPHE
            // (doubled) then pull it out.
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(0) == APOSTROPHE &&
                   quoteBuf.charAt(1) == APOSTROPHE) {
                rule.append(BACKSLASH).append(APOSTROPHE);
                quoteBuf.remove(0, 2);
            }
            // If the last thing in the quoteBuf is APOSTROPHE
            // (doubled) then remove and count it and add it after.
            int32_t trailingCount = 0;
            while (quoteBuf.length() >= 2 &&
                   quoteBuf.charAt(quoteBuf.length()-2) == APOSTROPHE &&
                   quoteBuf.charAt(quoteBuf.length()-1) == APOSTROPHE) {
                quoteBuf.truncate(quoteBuf.length()-2);
                ++trailingCount;
            }
            if (quoteBuf.length() > 0) {
                rule.append(APOSTROPHE);
                rule.append(quoteBuf);
                rule.append(APOSTROPHE);
                quoteBuf.truncate(0);
            }
            while (trailingCount-- > 0) {
                rule.append(BACKSLASH).append(APOSTROPHE);
            }
        }
        if (c != (UChar32)-1) {
            /* Since spaces are ignored during parsing, they are
             * emitted only for readability.  We emit one here
             * only if there isn't already one at the end of the
             * rule.
             */
            if (c == SPACE) {
                int32_t len = rule.length();
                if (len > 0 && rule.charAt(len-1) != c) {
                    rule.append(c);
                }
            } else if (!escapeUnprintable || !ICU_Utility::escapeUnprintable(rule, c)) {
                rule.append(c);
            }
        }
    }

    // Escape ' and '\' and don't begin a quote just for them
    else if (quoteBuf.length() == 0 &&
             (c == APOSTROPHE || c == BACKSLASH)) {
        rule.append(BACKSLASH);
        rule.append(c);
    }

    // Specials (printable ascii that isn't [0-9a-zA-Z]) and
    // whitespace need quoting.  Also append stuff to quotes if we are
    // building up a quoted substring already.
    else if (quoteBuf.length() > 0 ||
             (c >= 0x0021 && c <= 0x007E &&
              !((c >= 0x0030/*'0'*/ && c <= 0x0039/*'9'*/) ||
                (c >= 0x0041/*'A'*/ && c <= 0x005A/*'Z'*/) ||
                (c >= 0x0061/*'a'*/ && c <= 0x007A/*'z'*/))) ||
             PatternProps::isWhiteSpace(c)) {
        quoteBuf.append(c);
        // Double ' within a quote
        if (c == APOSTROPHE) {
            quoteBuf.append(c);
        }
    }
    
    // Otherwise just append
    else {
        rule.append(c);
    }
}